

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ODCode39Reader.cpp
# Opt level: O1

Barcode * __thiscall
ZXing::OneD::Code39Reader::decodePattern
          (Barcode *__return_storage_ptr__,Code39Reader *this,int rowNumber,PatternView *next,
          unique_ptr<ZXing::OneD::RowReader::DecodingState,_std::default_delete<ZXing::OneD::RowReader::DecodingState>_>
          *param_3)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  char cVar2;
  byte bVar3;
  ushort *puVar4;
  uint uVar5;
  ReaderOptions RVar6;
  char cVar7;
  int iVar8;
  int iVar9;
  Iterator *ppuVar10;
  Iterator puVar11;
  _Alloc_hider _Var12;
  int *piVar13;
  ushort uVar14;
  undefined2 uVar15;
  PatternView *view;
  long lVar16;
  char *pcVar17;
  char *pcVar18;
  char *pcVar19;
  Iterator puVar20;
  char *pcVar21;
  undefined1 uVar22;
  bool bVar23;
  float fVar24;
  anon_class_16_2_7a905435 isGuard;
  char shiftChars [5];
  uint local_134;
  string txt;
  PatternView local_108;
  undefined7 local_e8;
  undefined1 uStack_e1;
  undefined2 uStack_e0;
  undefined1 uStack_de;
  undefined5 uStack_dd;
  string fullASCII;
  string local_b8;
  Error local_98;
  Iterator *local_68;
  int local_60 [2];
  undefined1 local_58 [13];
  undefined2 local_4b;
  undefined1 local_49;
  FixedSparcePattern<CHAR_LEN,_6> START_PATTERN;
  
  iVar9 = -(uint)(((undefined1  [12])*(this->super_RowReader)._opts & (undefined1  [12])0x40) ==
                 (undefined1  [12])0x0);
  START_PATTERN._data[0] = 0;
  START_PATTERN._data[1] = 2;
  START_PATTERN._data[2] = 3;
  START_PATTERN._data[3] = 5;
  START_PATTERN._data[4] = 7;
  START_PATTERN._data[5] = 8;
  START_PATTERN._data[6] = 0;
  START_PATTERN._data[7] = 0;
  START_PATTERN._data[8] = 0;
  uVar5 = (iVar9 + 4) * 9;
  view = (PatternView *)0x9;
  if (9 < (int)uVar5) {
    view = (PatternView *)(ulong)uVar5;
  }
  isGuard.minQuietZone = 6.0;
  isGuard.pattern = (FixedPattern<9,_6,_true> *)param_3;
  FindLeftGuard<9,ZXing::FindLeftGuard<9,6,true>(ZXing::PatternView_const&,int,ZXing::FixedPattern<9,6,true>const&,double)::_lambda(ZXing::PatternView_const&,int)_1_>
            (&local_108,(ZXing *)next,view,(int)&START_PATTERN,isGuard);
  *(int *)&next->_base = (int)local_108._base;
  *(undefined4 *)((long)&next->_base + 4) = local_108._base._4_4_;
  *(undefined4 *)&next->_end = local_108._end._0_4_;
  *(uint *)((long)&next->_end + 4) =
       CONCAT13(local_108._end._7_1_,CONCAT21(local_108._end._5_2_,local_108._end._4_1_));
  next->_data = local_108._data;
  next->_size = local_108._size;
  *(undefined4 *)&next->field_0xc = local_108._12_4_;
  puVar20 = next->_data;
  if (((puVar20 == (Iterator)0x0) || (puVar20 < next->_base)) ||
     (next->_end < puVar20 + next->_size)) {
LAB_0015c346:
    memset(__return_storage_ptr__,0,0xd8);
    Result::Result(__return_storage_ptr__);
    return __return_storage_ptr__;
  }
  iVar8 = RowReader::NarrowWideBitPattern(next);
  cVar7 = RowReader::LookupBitPattern<int[44],char[45]>
                    (iVar8,(int (*) [44])CHARACTER_ENCODINGS,
                     (char (*) [45])"0123456789ABCDEFGHIJKLMNOPQRSTUVWXYZ-. $/+%*");
  if (cVar7 != '*') goto LAB_0015c346;
  puVar20 = next->_data;
  puVar11 = next->_base;
  if (puVar11 == puVar20) {
    local_134 = 0;
  }
  else {
    uVar14 = 0;
    do {
      uVar14 = uVar14 + *puVar11;
      puVar11 = puVar11 + 1;
    } while (puVar11 != puVar20);
    local_134 = (uint)uVar14;
  }
  if ((long)next->_size == 0) {
    uVar14 = 0;
  }
  else {
    lVar16 = 0;
    uVar14 = 0;
    do {
      uVar14 = uVar14 + *(short *)((long)puVar20 + lVar16);
      lVar16 = lVar16 + 2;
    } while ((long)next->_size * 2 != lVar16);
    uVar14 = uVar14 >> 1;
  }
  txt._M_dataplus._M_p = (pointer)&txt.field_2;
  txt._M_string_length = 0;
  txt.field_2._M_local_buf[0] = '\0';
  std::__cxx11::string::reserve((ulong)&txt);
  do {
    if (((next->_data == (Iterator)0x0) ||
        (puVar20 = next->_data + next->_size, next->_data = puVar20,
        next->_end < puVar20 + next->_size)) ||
       ((puVar4 = next->_data, puVar4 == (ushort *)0x0 ||
        ((next->_data = puVar4 + 1, next->_end < puVar4 + (long)next->_size + 1 ||
         (uVar14 < *puVar4)))))) goto LAB_0015c51b;
    iVar8 = RowReader::NarrowWideBitPattern(next);
    RowReader::LookupBitPattern<int[44],char[45]>
              (iVar8,(int (*) [44])CHARACTER_ENCODINGS,
               (char (*) [45])"0123456789ABCDEFGHIJKLMNOPQRSTUVWXYZ-. $/+%*");
    std::__cxx11::string::push_back((char)&txt);
    if (txt._M_dataplus._M_p[txt._M_string_length - 1] == '\0') goto LAB_0015c51b;
  } while (txt._M_dataplus._M_p[txt._M_string_length - 1] != '*');
  std::__cxx11::string::pop_back();
  if ((int)txt._M_string_length < iVar9 + 2) {
LAB_0015c51b:
    memset(__return_storage_ptr__,0,0xd8);
    Result::Result(__return_storage_ptr__);
    goto LAB_0015c532;
  }
  iVar9 = next->_size;
  puVar4 = next->_data + iVar9;
  if (puVar4 != next->_end + -1) {
    if (iVar9 == 0) {
      fVar24 = 0.0;
    }
    else {
      lVar16 = 0;
      uVar14 = 0;
      do {
        uVar14 = uVar14 + *(short *)((long)next->_data + lVar16);
        lVar16 = lVar16 + 2;
      } while ((long)iVar9 * 2 != lVar16);
      fVar24 = (float)uVar14 * 0.5;
    }
    if ((float)*puVar4 < fVar24) goto LAB_0015c51b;
  }
  cVar7 = txt._M_dataplus._M_p[txt._M_string_length - 1];
  std::__cxx11::string::pop_back();
  iVar9 = TransformReduce<std::__cxx11::string,int,ZXing::OneD::Code39Reader::decodePattern(int,ZXing::PatternView&,std::unique_ptr<ZXing::OneD::RowReader::DecodingState,std::default_delete<ZXing::OneD::RowReader::DecodingState>>&)const::__1>
                    (&txt);
  cVar2 = "0123456789ABCDEFGHIJKLMNOPQRSTUVWXYZ-. $/+%*"[iVar9 % 0x2b];
  if (cVar7 != cVar2) {
    std::__cxx11::string::push_back((char)&txt);
  }
  builtin_strncpy(shiftChars,"$%/+",5);
  RVar6 = *(this->super_RowReader)._opts;
  if (((undefined1  [12])RVar6 & (undefined1  [12])0x20) == (undefined1  [12])0x0) {
    fullASCII._M_dataplus._M_p = (pointer)&fullASCII.field_2;
    std::__cxx11::string::_M_construct<char_const*>();
  }
  else {
    local_b8._M_dataplus._M_p = (pointer)&local_b8.field_2;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_b8,txt._M_dataplus._M_p,txt._M_dataplus._M_p + txt._M_string_length)
    ;
    DecodeCode39AndCode93FullASCII(&fullASCII,&local_b8,shiftChars);
  }
  if ((((undefined1  [12])RVar6 & (undefined1  [12])0x20) != (undefined1  [12])0x0) &&
     ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_b8._M_dataplus._M_p != &local_b8.field_2)) {
    operator_delete(local_b8._M_dataplus._M_p,local_b8.field_2._M_allocated_capacity + 1);
  }
  if (fullASCII._M_string_length == 0) {
    bVar23 = false;
  }
  else {
    pcVar21 = txt._M_dataplus._M_p + txt._M_string_length;
    pcVar19 = pcVar21;
    if (txt._M_string_length != 0) {
      _Var12._M_p = txt._M_dataplus._M_p;
      pcVar17 = pcVar21;
      do {
        if (*_Var12._M_p == shiftChars[0]) {
          bVar23 = false;
          pcVar18 = _Var12._M_p;
        }
        else {
          lVar16 = 1;
          do {
            bVar23 = lVar16 == 4;
            pcVar18 = pcVar17;
            if (bVar23) break;
            pcVar19 = shiftChars + lVar16;
            pcVar18 = _Var12._M_p;
            lVar16 = lVar16 + 1;
          } while (*_Var12._M_p != *pcVar19);
        }
        pcVar19 = pcVar18;
      } while ((bVar23) &&
              (_Var12._M_p = _Var12._M_p + 1, pcVar19 = pcVar21, pcVar17 = pcVar18,
              _Var12._M_p != pcVar21));
    }
    bVar23 = pcVar19 != pcVar21;
  }
  if (bVar23 != false) {
    std::__cxx11::string::_M_assign((string *)&txt);
  }
  if (cVar7 == cVar2) {
    std::__cxx11::string::push_back((char)&txt);
LAB_0015c753:
    ppuVar10 = &local_108._base;
    uStack_dd = 0;
    local_108._base._0_4_ = 0;
    local_108._base._4_4_ = 0;
    local_108._end._0_4_ = 0;
    local_108._end._4_1_ = 0;
    local_108._end._5_2_ = 0;
    local_108._end._7_1_ = 0;
    uVar15 = 0xffff;
    piVar13 = &local_108._size;
    pcVar21 = (char *)0x0;
    uVar22 = 0;
  }
  else {
    if (((undefined1  [12])*(this->super_RowReader)._opts & (undefined1  [12])0x40) ==
        (undefined1  [12])0x0) goto LAB_0015c753;
    ppuVar10 = (Iterator *)local_58;
    piVar13 = local_60;
    local_60[0] = 0;
    local_60[1] = 0;
    local_58[0] = 0;
    local_108._base._1_3_ = (uint3)local_58._1_8_;
    local_108._base._0_4_ = (uint)local_108._base._1_3_ << 8;
    local_108._base._4_4_ = SUB84(local_58._1_8_,3);
    local_108._end._0_1_ = SUB81(local_58._1_8_,7);
    local_108._end._1_3_ = (undefined3)local_58._9_4_;
    local_108._end._4_1_ = SUB41(local_58._9_4_,3);
    local_108._end._5_2_ = local_4b;
    local_108._end._7_1_ = local_49;
    uVar22 = 2;
    uVar15 = 0x84;
    pcVar21 = "src/oned/ODCode39Reader.cpp";
    local_68 = ppuVar10;
  }
  local_108._data = (Iterator)&local_108._base;
  local_108._8_8_ = 0;
  *(undefined8 *)piVar13 = 0;
  *(undefined1 *)ppuVar10 = 0;
  local_e8 = SUB87(pcVar21,0);
  uStack_e1 = 0;
  puVar20 = next->_base;
  if (puVar20 == next->_data + next->_size) {
    iVar9 = -1;
  }
  else {
    uVar14 = 0;
    do {
      uVar14 = uVar14 + *puVar20;
      puVar20 = puVar20 + 1;
    } while (puVar20 != next->_data + next->_size);
    iVar9 = uVar14 - 1;
  }
  bVar3 = (&DAT_00198618)[(ulong)(cVar7 == cVar2) + (ulong)bVar23 * 2];
  paVar1 = &local_98._msg.field_2;
  uStack_e0 = uVar15;
  uStack_de = uVar22;
  local_98._msg._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_98,local_108._data,local_108._8_8_ + (long)local_108._data);
  local_98._file._0_7_ = local_e8;
  local_98._40_3_ = SUB43(CONCAT13(uStack_de,CONCAT21(uStack_e0,uStack_e1)) >> 8,0);
  local_98._file._7_1_ = uStack_e1;
  Result::Result(__return_storage_ptr__,&txt,rowNumber,local_134,iVar9,Code39,
                 (SymbologyIdentifier)((uint)bVar3 << 8 | 0x41),&local_98,false);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_98._msg._M_dataplus._M_p != paVar1) {
    operator_delete(local_98._msg._M_dataplus._M_p,local_98._msg.field_2._M_allocated_capacity + 1);
  }
  if ((Iterator *)local_108._data != &local_108._base) {
    operator_delete(local_108._data,CONCAT44(local_108._base._4_4_,(int)local_108._base) + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)fullASCII._M_dataplus._M_p != &fullASCII.field_2) {
    operator_delete(fullASCII._M_dataplus._M_p,fullASCII.field_2._M_allocated_capacity + 1);
  }
LAB_0015c532:
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)txt._M_dataplus._M_p == &txt.field_2) {
    return __return_storage_ptr__;
  }
  operator_delete(txt._M_dataplus._M_p,
                  CONCAT71(txt.field_2._M_allocated_capacity._1_7_,txt.field_2._M_local_buf[0]) + 1)
  ;
  return __return_storage_ptr__;
}

Assistant:

Barcode Code39Reader::decodePattern(int rowNumber, PatternView& next, std::unique_ptr<RowReader::DecodingState>&) const
{
	// minimal number of characters that must be present (including start, stop and checksum characters)
	int minCharCount = _opts.validateCode39CheckSum() ? 4 : 3;
	auto isStartOrStopSymbol = [](char c) { return c == '*'; };

	// provide the indices with the narrow bars/spaces which have to be equally wide
	constexpr auto START_PATTERN = FixedSparcePattern<CHAR_LEN, 6>{0, 2, 3, 5, 7, 8};
	// quiet zone is half the width of a character symbol
	constexpr float QUIET_ZONE_SCALE = 0.5f;

	next = FindLeftGuard(next, minCharCount * CHAR_LEN, START_PATTERN, QUIET_ZONE_SCALE * 12);
	if (!next.isValid())
		return {};

	if (!isStartOrStopSymbol(DecodeNarrowWidePattern(next, CHARACTER_ENCODINGS, ALPHABET))) // read off the start pattern
		return {};

	int xStart = next.pixelsInFront();
	int maxInterCharacterSpace = next.sum() / 2; // spec actually says 1 narrow space, width/2 is about 4

	std::string txt;
	txt.reserve(20);

	do {
		// check remaining input width and inter-character space
		if (!next.skipSymbol() || !next.skipSingle(maxInterCharacterSpace))
			return {};

		txt += DecodeNarrowWidePattern(next, CHARACTER_ENCODINGS, ALPHABET);
		if (txt.back() == 0)
			return {};
	} while (!isStartOrStopSymbol(txt.back()));

	txt.pop_back(); // remove asterisk

	// check txt length and whitespace after the last char. See also FindStartPattern.
	if (Size(txt) < minCharCount - 2 || !next.hasQuietZoneAfter(QUIET_ZONE_SCALE))
		return {};

	auto lastChar = txt.back();
	txt.pop_back();
	int checksum = TransformReduce(txt, 0, [](char c) { return IndexOf(ALPHABET, c); });
	bool hasValidCheckSum = lastChar == ALPHABET[checksum % 43];
	if (!hasValidCheckSum)
		txt.push_back(lastChar);

	const char shiftChars[] = "$%/+";
	auto fullASCII = _opts.tryCode39ExtendedMode() ? DecodeCode39AndCode93FullASCII(txt, shiftChars) : "";
	bool hasFullASCII = !fullASCII.empty() && std::find_first_of(txt.begin(), txt.end(), shiftChars, shiftChars + 4) != txt.end();
	if (hasFullASCII)
		txt = fullASCII;

	if (hasValidCheckSum)
		txt.push_back(lastChar);

	Error error = _opts.validateCode39CheckSum() && !hasValidCheckSum ? ChecksumError() : Error();

	// Symbology identifier modifiers ISO/IEC 16388:2007 Annex C Table C.1
	constexpr const char symbologyModifiers[4] = { '0', '1' /*checksum*/, '4' /*full ASCII*/, '5' /*checksum + full ASCII*/ };
	SymbologyIdentifier symbologyIdentifier = {'A', symbologyModifiers[(int)hasValidCheckSum + 2 * (int)hasFullASCII]};

	int xStop = next.pixelsTillEnd();
	return {std::move(txt), rowNumber, xStart, xStop, BarcodeFormat::Code39, symbologyIdentifier, error};
}